

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::mkdir_p_asstring
          (QString *__return_storage_ptr__,MakefileGenerator *this,QString *dir,bool escape)

{
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QStringBuilder<const_char_(&)[2],_QString> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,escape) == 0) {
    local_80.d = (dir->d).d;
    local_80.ptr = (dir->d).ptr;
    local_80.size = (dir->d).size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    Option::fixPathToTargetOS((QString *)&QStack_98,dir,false,false);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_80,this,&QStack_98);
  }
  QString::arg<QString,_true>
            ((QString *)&local_68,&this->makedir,(QString *)&local_80,0,(QChar)0x20);
  local_50.b.d.size = local_68.size;
  local_50.b.d.ptr = local_68.ptr;
  local_50.b.d.d = local_68.d;
  local_50.a = (char (*) [2])0x21b500;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QStringBuilder<const_char_(&)[2],_QString>::convertTo<QString>(__return_storage_ptr__,&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (escape) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::mkdir_p_asstring(const QString &dir, bool escape) const
{
    return "@" + makedir.arg(
        escape ? escapeFilePath(Option::fixPathToTargetOS(dir, false, false)) : dir);
}